

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall CConnman::PerformReconnections(CConnman *this)

{
  list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> *__offin;
  bool use_v2transport;
  long lVar1;
  int iVar2;
  __off64_t *__offout;
  _List_node_base *p_Var3;
  size_t __len;
  long in_FS_OFFSET;
  uint in_stack_ffffffffffffff88;
  list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> todo;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock106;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __offin = &this->m_reconnections;
  do {
    todo.super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>.
    _M_impl._M_node._M_size = 0;
    __offout = (__off64_t *)0xf4e;
    __len = 0;
    todo.super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&todo;
    todo.super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&todo;
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&criticalblock106.super_unique_lock,
               &this->m_reconnections_mutex,"m_reconnections_mutex",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
               ,0xf4e,false);
    p_Var3 = (__offin->
             super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    iVar2 = 3;
    if (p_Var3 != (_List_node_base *)__offin) {
      std::__cxx11::list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>::
      splice(&todo,(int)(_List_node_base *)&todo,(__off64_t *)__offin,(int)p_Var3,__offout,__len,
             in_stack_ffffffffffffff88);
      iVar2 = 0;
    }
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock106.super_unique_lock);
    if (p_Var3 != (_List_node_base *)__offin) {
      if (todo.
          super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>.
          _M_impl._M_node.super__List_node_base._M_next[6]._M_next == (_List_node_base *)0x0) {
        p_Var3 = (_List_node_base *)0x0;
      }
      else {
        p_Var3 = todo.
                 super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
                 ._M_impl._M_node.super__List_node_base._M_next[5]._M_prev;
      }
      use_v2transport =
           *(bool *)((long)&todo.
                            super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
                            ._M_impl._M_node.super__List_node_base._M_next[7]._M_prev + 4);
      iVar2 = 0;
      in_stack_ffffffffffffff88 = (uint)use_v2transport;
      OpenNetworkConnection
                (this,(CAddress *)
                      (todo.
                       super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
                       ._M_impl._M_node.super__List_node_base._M_next + 1),false,
                 (CSemaphoreGrant *)
                 &todo.
                  super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
                  ._M_impl._M_node.super__List_node_base._M_next[4]._M_prev,(char *)p_Var3,
                 *(ConnectionType *)
                  &todo.
                   super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
                   ._M_impl._M_node.super__List_node_base._M_next[7]._M_prev,use_v2transport);
    }
    std::__cxx11::
    _List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>::_M_clear
              ((_List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
                *)&todo);
  } while (iVar2 == 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::PerformReconnections()
{
    AssertLockNotHeld(m_reconnections_mutex);
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    while (true) {
        // Move first element of m_reconnections to todo (avoiding an allocation inside the lock).
        decltype(m_reconnections) todo;
        {
            LOCK(m_reconnections_mutex);
            if (m_reconnections.empty()) break;
            todo.splice(todo.end(), m_reconnections, m_reconnections.begin());
        }

        auto& item = *todo.begin();
        OpenNetworkConnection(item.addr_connect,
                              // We only reconnect if the first attempt to connect succeeded at
                              // connection time, but then failed after the CNode object was
                              // created. Since we already know connecting is possible, do not
                              // count failure to reconnect.
                              /*fCountFailure=*/false,
                              std::move(item.grant),
                              item.destination.empty() ? nullptr : item.destination.c_str(),
                              item.conn_type,
                              item.use_v2transport);
    }
}